

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
              (void)

{
  char *message;
  int iStack0000000000000008;
  undefined4 in_stack_00000018;
  __int128 in_stack_ffffffffffffffe8;
  precision_checker<fmt::v7::detail::error_handler> local_8;
  
  local_8.handler_ = (error_handler *)&stack0xfffffffffffffff7;
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 =
         precision_checker<fmt::v7::detail::error_handler>::operator()<int,_0>
                   (&local_8,iStack0000000000000008);
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
    _iStack0000000000000008 =
         precision_checker<fmt::v7::detail::error_handler>::operator()<long_long,_0>
                   (&local_8,_iStack0000000000000008);
    break;
  case 4:
  case 6:
    break;
  case 5:
    _iStack0000000000000008 =
         precision_checker<fmt::v7::detail::error_handler>::operator()<__int128,_0>
                   (&local_8,in_stack_ffffffffffffffe8);
    break;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    message = "precision is not integer";
    goto LAB_00121e88;
  default:
    _iStack0000000000000008 =
         precision_checker<fmt::v7::detail::error_handler>::operator()<fmt::v7::monostate,_0>
                   (&local_8);
  }
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  message = "number is too big";
LAB_00121e88:
  error_handler::on_error((error_handler *)&stack0xfffffffffffffff7,message);
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}